

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

SUNErrCode SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pvVar6 = A->content;
  lVar5 = *(long *)((long)pvVar6 + 0x18);
  pvVar4 = B->content;
  lVar7 = *(long *)((long)pvVar4 + 0x18);
  if (lVar7 < lVar5) {
    lVar8 = *(long *)((long)pvVar4 + 0x20);
    lVar9 = *(long *)((long)pvVar6 + 0x20);
  }
  else {
    lVar9 = *(long *)((long)pvVar6 + 0x20);
    lVar8 = *(long *)((long)pvVar4 + 0x20);
    if (lVar9 <= lVar8) goto LAB_0014fc0b;
  }
  if (lVar9 < lVar8) {
    lVar9 = lVar8;
  }
  if (lVar5 < lVar7) {
    lVar5 = lVar7;
  }
  lVar7 = *(long *)((long)pvVar6 + 0x28);
  if (*(long *)((long)pvVar6 + 0x28) < *(long *)((long)pvVar4 + 0x28)) {
    lVar7 = *(long *)((long)pvVar4 + 0x28);
  }
  lVar8 = lVar9 + lVar7 + 1;
  *(long *)((long)pvVar4 + 0x18) = lVar5;
  *(long *)((long)pvVar4 + 0x20) = lVar9;
  *(long *)((long)pvVar4 + 0x28) = lVar7;
  *(long *)((long)pvVar4 + 0x10) = lVar8;
  lVar8 = lVar8 * *(long *)((long)pvVar4 + 8);
  *(long *)((long)pvVar4 + 0x38) = lVar8;
  pvVar4 = realloc(*(void **)((long)pvVar4 + 0x30),lVar8 * 8);
  pvVar6 = B->content;
  *(void **)((long)pvVar6 + 0x30) = pvVar4;
  lVar5 = 0;
  for (lVar8 = 0; lVar8 < *(long *)((long)pvVar6 + 8); lVar8 = lVar8 + 1) {
    *(long *)(*(long *)((long)pvVar6 + 0x40) + lVar8 * 8) = *(long *)((long)pvVar6 + 0x30) + lVar5;
    pvVar6 = B->content;
    lVar5 = lVar5 + (lVar9 + lVar7) * 8 + 8;
  }
LAB_0014fc0b:
  SUNMatZero_Band(B);
  pvVar6 = B->content;
  lVar7 = 0;
  lVar5 = *(long *)((long)pvVar6 + 8);
  if (*(long *)((long)pvVar6 + 8) < 1) {
    lVar5 = lVar7;
  }
  for (; lVar7 != lVar5; lVar7 = lVar7 + 1) {
    lVar8 = *(long *)((long)pvVar6 + 0x28);
    lVar9 = *(long *)(*(long *)((long)pvVar6 + 0x40) + lVar7 * 8);
    pvVar4 = A->content;
    lVar1 = *(long *)((long)pvVar4 + 0x28);
    lVar2 = *(long *)(*(long *)((long)pvVar4 + 0x40) + lVar7 * 8);
    lVar3 = *(long *)((long)pvVar4 + 0x20);
    for (lVar10 = -*(long *)((long)pvVar4 + 0x18); lVar10 <= lVar3; lVar10 = lVar10 + 1) {
      *(undefined8 *)(lVar8 * 8 + lVar9 + lVar10 * 8) =
           *(undefined8 *)(lVar1 * 8 + lVar2 + lVar10 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, colSize, ml, mu, smu;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Grow B if A's bandwidth is larger */
  if ((SM_UBAND_B(A) > SM_UBAND_B(B)) || (SM_LBAND_B(A) > SM_LBAND_B(B)))
  {
    ml                     = SUNMAX(SM_LBAND_B(B), SM_LBAND_B(A));
    mu                     = SUNMAX(SM_UBAND_B(B), SM_UBAND_B(A));
    smu                    = SUNMAX(SM_SUBAND_B(B), SM_SUBAND_B(A));
    colSize                = smu + ml + 1;
    SM_CONTENT_B(B)->mu    = mu;
    SM_CONTENT_B(B)->ml    = ml;
    SM_CONTENT_B(B)->s_mu  = smu;
    SM_CONTENT_B(B)->ldim  = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data =
      (sunrealtype*)realloc(SM_CONTENT_B(B)->data,
                            SM_COLUMNS_B(B) * colSize * sizeof(sunrealtype));
    for (j = 0; j < SM_COLUMNS_B(B); j++)
    {
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
    }
  }

  /* Perform operation */
  SUNCheckCall(SUNMatZero_Band(B));
  for (j = 0; j < SM_COLUMNS_B(B); j++)
  {
    B_colj = SM_COLUMN_B(B, j);
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { B_colj[i] = A_colj[i]; }
  }
  return SUN_SUCCESS;
}